

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::deinit
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  Functions *gl;
  GeometryShaderLayeredRenderingBoundaryCondition *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(0);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x78))(0x8ca9,0);
  (**(code **)(lVar4 + 0x78))(0x8ca8,0);
  local_1c = 0;
  while( true ) {
    sVar5 = std::
            vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
            ::size(&this->m_textures_info);
    if (sVar5 <= local_1c) break;
    pcVar1 = *(code **)(lVar4 + 0xb8);
    pvVar6 = std::
             vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ::operator[](&this->m_textures_info,(ulong)local_1c);
    (*pcVar1)(pvVar6->m_texture_target,0);
    local_1c = local_1c + 1;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_po_id);
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_fs_id);
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_gs_id);
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_vs_id);
  }
  local_20 = 0;
  while( true ) {
    sVar5 = std::
            vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
            ::size(&this->m_textures_info);
    if (sVar5 <= local_20) break;
    pcVar1 = *(code **)(lVar4 + 0x480);
    pvVar6 = std::
             vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ::operator[](&this->m_textures_info,(ulong)local_20);
    (*pcVar1)(1,&pvVar6->m_id);
    local_20 = local_20 + 1;
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_read_id);
  }
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_draw_id);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredRenderingBoundaryCondition::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, 0);
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
	}

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.deleteTextures(1, &m_textures_info[i].m_id);
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);
	}

	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}